

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFileStoreTests::
TestresetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionary::RunImpl
          (TestresetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionary *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_e8 [8];
  resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper fixtureHelper
  ;
  bool ctorOk;
  TestresetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionary *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper::
  resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper
            ((resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper *
             )local_e8,&(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::
  ExecuteTest<SuiteFileStoreTests::resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper>
            ((resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper *
             )local_e8,&(this->super_Test).m_details);
  resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper::
  ~resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper
            ((resetBeforeAndAfterWithTestFileManagerFileStoreFactory_FileStoreFromDictionaryHelper *
             )local_e8);
  return;
}

Assistant:

TEST_FIXTURE(resetBeforeAndAfterWithTestFileManager, FileStoreFactory_FileStoreFromDictionary) {
  SessionID sessionID( BeginString( "FIX.4.2" ),
      SenderCompID( "SETGET" ), TargetCompID( "TEST" ));
  Dictionary dictionary;
  dictionary.setString("ConnectionType", "acceptor");
  dictionary.setString("FileStorePath", "store");

  SessionSettings settings;
  settings.set(sessionID, dictionary);
  FileStoreFactory fileStoreFactory(settings);

  MessageStore* fileStore = fileStoreFactory.create(sessionID);
  CHECK(fileStore != nullptr);
}